

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_dv.c
# Opt level: O3

void dtl_dv_delete(dtl_dv_t *dv)

{
  if (dv != (dtl_dv_t *)0x0) {
    switch(dv->u32Flags & 0xf) {
    case 1:
      free(dv);
      return;
    case 2:
      dtl_sv_delete((dtl_sv_t *)dv);
      return;
    case 3:
      dtl_av_delete((dtl_av_t *)dv);
      return;
    case 4:
      dtl_hv_delete((dtl_hv_t *)dv);
      return;
    }
  }
  return;
}

Assistant:

void dtl_dv_delete(dtl_dv_t* dv ){
	if(dv){
		switch(dtl_dv_type(dv))
		{
		case DTL_DV_INVALID:
			break;
		case DTL_DV_NULL:
			free(dv);
			break;
		case DTL_DV_SCALAR:
			dtl_sv_delete((dtl_sv_t*) dv);
			break;
		case DTL_DV_ARRAY:
			dtl_av_delete((dtl_av_t*) dv);
			break;
		case DTL_DV_HASH:
			dtl_hv_delete((dtl_hv_t*) dv);
			break;
		}
	}
}